

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall
SslTcpSocketImpl::SslTcpSocketImpl
          (SslTcpSocketImpl *this,BaseSocket *pBkref,TcpSocketImpl *pTcpSocket)

{
  SslTcpSocketImpl *local_98;
  code *local_90;
  undefined8 local_88;
  type local_80;
  SslTcpSocketImpl *local_58;
  code *local_50;
  undefined8 local_48;
  type local_40;
  anon_class_8_1_8991fb9c local_28;
  TcpSocketImpl *local_20;
  TcpSocketImpl *pTcpSocket_local;
  BaseSocket *pBkref_local;
  SslTcpSocketImpl *this_local;
  
  local_20 = pTcpSocket;
  pTcpSocket_local = (TcpSocketImpl *)pBkref;
  pBkref_local = (BaseSocket *)this;
  TcpSocketImpl::TcpSocketImpl(&this->super_TcpSocketImpl,pBkref,pTcpSocket);
  (this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslTcpSocketImpl_001b8d80;
  OpenSSLWrapper::SslClientContext::SslClientContext(&this->m_pClientCtx);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  vector(&this->m_pServerCtx);
  std::unique_ptr<OpenSSLWrapper::SslConnection,std::default_delete<OpenSSLWrapper::SslConnection>>
  ::unique_ptr<std::default_delete<OpenSSLWrapper::SslConnection>,void>
            ((unique_ptr<OpenSSLWrapper::SslConnection,std::default_delete<OpenSSLWrapper::SslConnection>>
              *)&this->m_pSslCon);
  std::function<void_(TcpSocket_*)>::function(&this->m_fClientConnected);
  std::function<void_(TcpSocket_*,_void_*)>::function(&this->m_fClientConnectedParam);
  this->m_bCloseReq = false;
  this->m_iSslInit = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_vProtoList);
  std::__cxx11::string::string((string *)&this->m_strTrustRootCert);
  std::mutex::mutex(&this->m_mxEnDecode);
  local_28.this = this;
  std::function<int()>::operator=
            ((function<int()> *)&(this->super_TcpSocketImpl).m_fnSslInitDone,&local_28);
  local_50 = DatenEncode;
  local_48 = 0;
  local_58 = this;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long),SslTcpSocketImpl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_40,(offset_in_SslTcpSocketImpl_to_subr *)&local_50,&local_58,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             &(this->super_TcpSocketImpl).m_fnSslEncode,&local_40);
  local_90 = DatenDecode;
  local_88 = 0;
  local_98 = this;
  std::
  bind<int(SslTcpSocketImpl::*)(unsigned_char_const*,unsigned_long,bool&),SslTcpSocketImpl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_80,(offset_in_SslTcpSocketImpl_to_subr *)&local_90,&local_98,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             &(this->super_TcpSocketImpl).m_fnSslDecode,&local_80);
  std::function<void_(TcpSocket_*)>::swap
            (&this->m_fClientConnected,&(this->super_TcpSocketImpl).m_fClientConnected);
  std::function<void_(TcpSocket_*,_void_*)>::swap
            (&this->m_fClientConnectedParam,&(this->super_TcpSocketImpl).m_fClientConnectedParam);
  return;
}

Assistant:

SslTcpSocketImpl::SslTcpSocketImpl(BaseSocket* pBkref, TcpSocketImpl* pTcpSocket) : TcpSocketImpl(pBkref, pTcpSocket), m_bCloseReq(false), m_iSslInit(0)
{   // Switch from Tcp to Ssl/Tls
    m_fnSslInitDone = [this]() noexcept -> int { return m_iSslInit; };
    m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, this, _1, _2);
    m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, this, _1, _2, _3);

    m_fClientConnected.swap(TcpSocketImpl::m_fClientConnected);
    m_fClientConnectedParam.swap(TcpSocketImpl::m_fClientConnectedParam);
}